

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O2

MetadataResult SetUICommand(ShellState *state,char **azArg,idx_t nArg)

{
  MetadataResult MVar1;
  idx_t i;
  ulong uVar2;
  string command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (nArg == 0) {
    MVar1 = PRINT_USAGE;
  }
  else {
    command._M_dataplus._M_p = (pointer)&command.field_2;
    command._M_string_length = 0;
    command.field_2._M_local_buf[0] = '\0';
    for (uVar2 = 1; nArg != uVar2; uVar2 = uVar2 + 1) {
      if (1 < uVar2) {
        std::__cxx11::string::append((char *)&command);
      }
      std::__cxx11::string::append((char *)&command);
    }
    std::operator+(&local_50,"CALL ",&command);
    std::__cxx11::string::operator=((string *)&state->ui_command,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&command);
    MVar1 = SUCCESS;
  }
  return MVar1;
}

Assistant:

MetadataResult SetUICommand(ShellState &state, const char **azArg, idx_t nArg) {
	if (nArg < 1) {
		return MetadataResult::PRINT_USAGE;
	}
	string command;
	for (idx_t i = 1; i < nArg; i++) {
		if (i > 1) {
			command += " ";
		}
		command += azArg[i];
	}
	state.ui_command = "CALL " + command;
	return MetadataResult::SUCCESS;
}